

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O2

handle * __thiscall pybind11::handle::dec_ref(handle *this)

{
  if (this->m_ptr != (PyObject *)0x0) {
    _Py_DECREF(this->m_ptr);
  }
  return this;
}

Assistant:

const handle &dec_ref() const & {
#ifdef PYBIND11_ASSERT_GIL_HELD_INCREF_DECREF
        if (m_ptr != nullptr && !PyGILState_Check()) {
            throw_gilstate_error("pybind11::handle::dec_ref()");
        }
#endif
        Py_XDECREF(m_ptr);
        return *this;
    }